

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpRegisterClient(Upnp_FunPtr Fun,void *Cookie,UpnpClient_Handle *Hnd)

{
  int iVar1;
  undefined4 *puVar2;
  int iVar3;
  char *file;
  
  if (UpnpSdkInit == 1) {
    iVar3 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x616,"Inside UpnpRegisterClient \n");
    if (Hnd == (UpnpClient_Handle *)0x0 || Fun == (Upnp_FunPtr)0x0) {
      iVar3 = -0x65;
    }
    else {
      HandleLock((char *)0x61b,iVar3);
      if (UpnpSdkDeviceRegisteredV4 + UpnpSdkClientRegistered + UpnpSdkDeviceregisteredV6 < 199) {
        iVar1 = GetFreeHandle();
        *Hnd = iVar1;
        if (iVar1 == -0x66) {
          file = (char *)0x623;
        }
        else {
          puVar2 = (undefined4 *)malloc(0x2f0);
          if (puVar2 != (undefined4 *)0x0) {
            *puVar2 = 0;
            *(Upnp_FunPtr *)(puVar2 + 2) = Fun;
            *(void **)(puVar2 + 4) = Cookie;
            *(undefined8 *)(puVar2 + 0xa2) = 0;
            iVar3 = 0;
            ListInit((LinkedList *)(puVar2 + 0xa4),(cmp_routine)0x0,(free_function)0x0);
            puVar2[0x8e] = 0;
            *(undefined8 *)(puVar2 + 0x9e) = 0xffffffffffffffff;
            HandleTable[*Hnd] = puVar2;
            UpnpSdkClientRegistered = UpnpSdkClientRegistered + 1;
            HandleUnlock((char *)0x637,iVar3);
            UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x63c,"Exiting UpnpRegisterClient \n")
            ;
            return 0;
          }
          file = (char *)0x628;
        }
        HandleUnlock(file,iVar3);
        iVar3 = -0x68;
      }
      else {
        HandleUnlock((char *)0x61f,iVar3);
        iVar3 = -0x78;
      }
    }
  }
  else {
    iVar3 = -0x74;
  }
  return iVar3;
}

Assistant:

int UpnpRegisterClient(
	Upnp_FunPtr Fun, const void *Cookie, UpnpClient_Handle *Hnd)
{
	struct Handle_Info *HInfo;

	if (UpnpSdkInit != 1)
		return UPNP_E_FINISH;
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpRegisterClient \n");
	if (Fun == NULL || Hnd == NULL)
		return UPNP_E_INVALID_PARAM;

	HandleLock(__FILE__, __LINE__);
	if ((NUM_HANDLE - 1) <=
		(UpnpSdkClientRegistered + UpnpSdkDeviceRegisteredV4 +
			UpnpSdkDeviceregisteredV6)) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_ALREADY_REGISTERED;
	}
	if ((*Hnd = GetFreeHandle()) == UPNP_E_OUTOF_HANDLE) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_OUTOF_MEMORY;
	}
	HInfo = (struct Handle_Info *)malloc(sizeof(struct Handle_Info));
	if (HInfo == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_OUTOF_MEMORY;
	}
	HInfo->HType = HND_CLIENT;
	HInfo->Callback = Fun;
	HInfo->Cookie = (void *)Cookie;
	HInfo->ClientSubList = NULL;
	ListInit(&HInfo->SsdpSearchList, NULL, NULL);
	#ifdef INCLUDE_DEVICE_APIS
	HInfo->MaxAge = 0;
	HInfo->MaxSubscriptions = UPNP_INFINITE;
	HInfo->MaxSubscriptionTimeOut = UPNP_INFINITE;
	#endif
	HandleTable[*Hnd] = HInfo;
	UpnpSdkClientRegistered += 1;
	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpRegisterClient \n");

	return UPNP_E_SUCCESS;
}